

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srt.c
# Opt level: O2

void srt_dump(srt_t *srt)

{
  double dVar1;
  vtt_block_t *pvVar2;
  uint uVar3;
  double dVar4;
  
  pvVar2 = (vtt_block_t *)&srt->cue_head;
  uVar3 = 1;
  while (pvVar2 = pvVar2->next, pvVar2 != (vtt_block_t *)0x0) {
    dVar1 = pvVar2->timestamp;
    dVar4 = dVar1 + pvVar2->duration;
    printf("%02d\r\n%d:%02d:%02d,%03d --> %02d:%02d:%02d,%03d\r\n%s\r\n",(ulong)uVar3,
           (long)(dVar1 / 3600.0) & 0xffffffff,(long)(dVar1 / 60.0) % 0x3c,(long)dVar1 % 0x3c,
           (long)(dVar1 * 1000.0) % 1000,(long)(dVar4 / 3600.0),(long)(dVar4 / 60.0) % 0x3c,
           (long)dVar4 % 0x3c,(long)(dVar4 * 1000.0) % 1000,pvVar2 + 1);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void srt_dump(srt_t* srt)
{
    int i;
    vtt_block_t* block;

    for (block = srt->cue_head, i = 1; block; block = block->next, ++i) {
        int hh1, hh2, mm1, mm2, ss1, ss2, ms1, ms2;
        vtt_crack_time(block->timestamp, &hh1, &mm1, &ss1, &ms1);
        vtt_crack_time(block->timestamp + block->duration, &hh2, &mm2, &ss2, &ms2);

        printf("%02d\r\n%d:%02d:%02d,%03d --> %02d:%02d:%02d,%03d\r\n%s\r\n", i,
            hh1, mm1, ss1, ms1, hh2, mm2, ss2, ms2, vtt_block_data(block));
    }
}